

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeErrorPrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar4;
  StaticType *type;
  LiteralString *pLVar1;
  JavascriptString *pJVar2;
  RuntimeFunction *pRVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,4,0);
  this = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(this->super_JavascriptLibraryBase).errorConstructor.ptr,6,0,0,uVar5);
  type = StringCache::GetStringTypeStatic(&this->stringCache);
  pLVar1 = LiteralString::New(type,L"Error",5,this->recycler);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x106,pLVar1,6,0,0,uVar5);
  pJVar2 = GetEmptyString(this);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x102,pJVar2,6,0,0,uVar5);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptError::EntryInfo::ToString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x178);
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x178,pRVar3,6,0,0,uVar5 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeErrorPrototype(DynamicObject* prototype, DeferredTypeHandlerBase* typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 4);

        JavascriptLibrary* library = prototype->GetLibrary();

        library->AddMember(prototype, PropertyIds::constructor, library->errorConstructor);

        bool hasNoEnumerableProperties = true;
        PropertyAttributes prototypeNameMessageAttributes = PropertyConfigurable | PropertyWritable;

        library->AddMember(prototype, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Error")), prototypeNameMessageAttributes);
        library->AddMember(prototype, PropertyIds::message, library->GetEmptyString(), prototypeNameMessageAttributes);
        library->AddFunctionToLibraryObject(prototype, PropertyIds::toString, &JavascriptError::EntryInfo::ToString, 0);

        prototype->SetHasNoEnumerableProperties(hasNoEnumerableProperties);

        return true;
    }